

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_245931::ProgressReporter::~ProgressReporter(ProgressReporter *this)

{
  ProgressReporter *this_local;
  
  (this->super_ProgressReporter)._vptr_ProgressReporter =
       (_func_int **)&PTR__ProgressReporter_0058d728;
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::string::~string((string *)&this->prefix);
  QPDFWriter::ProgressReporter::~ProgressReporter(&this->super_ProgressReporter);
  return;
}

Assistant:

~ProgressReporter() override = default;